

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void __thiscall xemmai::ast::t_for::f_flow(t_for *this,t_flow *a_flow)

{
  bool bVar1;
  reference puVar2;
  pointer ptVar3;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *__range2_2;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *__range2_1;
  t_targets targets1;
  t_targets *targets0;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *__range2;
  t_flow *a_flow_local;
  t_for *this_local;
  
  __end2 = std::
           vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ::begin(&this->v_initialization);
  p = (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
      ::end(&this->v_initialization);
  while (bVar1 = __gnu_cxx::
                 operator==<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                           (&__end2,(__normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                                     *)&p), ((bVar1 ^ 0xffU) & 1) != 0) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
             ::operator*(&__end2);
    ptVar3 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(puVar2);
    (*ptVar3->_vptr_t_node[2])(ptVar3,a_flow);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
    ::operator++(&__end2);
  }
  t_block::f_next(a_flow->v_current,&this->v_junction_condition);
  t_block::f_next(&this->v_junction_condition,&this->v_block_condition);
  a_flow->v_current = &this->v_block_condition;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->v_condition);
  if (bVar1) {
    ptVar3 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(&this->v_condition);
    (*ptVar3->_vptr_t_node[2])(ptVar3,a_flow);
  }
  t_block::f_next(a_flow->v_current,&this->v_block_block);
  t_block::f_next(a_flow->v_current,&this->v_junction_exit);
  targets1.v_return = (t_block *)a_flow->v_targets;
  __range2_1 = (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                *)&this->v_junction_exit;
  targets1.v_break = &this->v_junction_next;
  targets1.v_continue =
       (t_block *)
       ((targets1.v_return)->v_privates).
       super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
       ._M_impl.super__Vector_impl_data._M_start;
  a_flow->v_targets = (t_targets *)&__range2_1;
  a_flow->v_current = &this->v_block_block;
  __end2_1 = std::
             vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ::begin(&this->v_block);
  p_1 = (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
        std::
        vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ::end(&this->v_block);
  while (bVar1 = __gnu_cxx::
                 operator==<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                             *)&p_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
             ::operator*(&__end2_1);
    ptVar3 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(puVar2);
    (*ptVar3->_vptr_t_node[2])(ptVar3,a_flow);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
    ::operator++(&__end2_1);
  }
  a_flow->v_targets = (t_targets *)targets1.v_return;
  t_block::f_next(a_flow->v_current,&this->v_junction_next);
  t_block::f_next(&this->v_junction_next,&this->v_block_next);
  a_flow->v_current = &this->v_block_next;
  __end2_2 = std::
             vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ::begin(&this->v_next);
  p_2 = (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
        std::
        vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        ::end(&this->v_next);
  while (bVar1 = __gnu_cxx::
                 operator==<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                           (&__end2_2,
                            (__normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                             *)&p_2), ((bVar1 ^ 0xffU) & 1) != 0) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
             ::operator*(&__end2_2);
    ptVar3 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(puVar2);
    (*ptVar3->_vptr_t_node[2])(ptVar3,a_flow);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
    ::operator++(&__end2_2);
  }
  t_block::f_next(a_flow->v_current,&this->v_junction_condition);
  t_block::f_next(&this->v_junction_exit,&this->v_block_exit);
  a_flow->v_current = &this->v_block_exit;
  return;
}

Assistant:

void t_for::f_flow(t_flow& a_flow)
{
	for (auto& p : v_initialization) p->f_flow(a_flow);
	a_flow.v_current->f_next(&v_junction_condition);
	v_junction_condition.f_next(&v_block_condition);
	a_flow.v_current = &v_block_condition;
	if (v_condition) v_condition->f_flow(a_flow);
	a_flow.v_current->f_next(&v_block_block);
	a_flow.v_current->f_next(&v_junction_exit);
	auto targets0 = a_flow.v_targets;
	t_flow::t_targets targets1{&v_junction_exit, &v_junction_next, targets0->v_return};
	a_flow.v_targets = &targets1;
	a_flow.v_current = &v_block_block;
	for (auto& p : v_block) p->f_flow(a_flow);
	a_flow.v_targets = targets0;
	a_flow.v_current->f_next(&v_junction_next);
	v_junction_next.f_next(&v_block_next);
	a_flow.v_current = &v_block_next;
	for (auto& p : v_next) p->f_flow(a_flow);
	a_flow.v_current->f_next(&v_junction_condition);
	v_junction_exit.f_next(&v_block_exit);
	a_flow.v_current = &v_block_exit;
}